

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNodeImpl.cpp
# Opt level: O1

short __thiscall
xercesc_4_0::DOMNodeImpl::reverseTreeOrderBitPattern(DOMNodeImpl *this,short pattern)

{
  if ((pattern & 2U) == 0) {
    if ((pattern & 4U) != 0) {
      pattern = pattern & 0xfff9U | 2;
    }
  }
  else {
    pattern = pattern & 0xfff9U | 4;
  }
  if ((pattern & 0x10U) == 0) {
    if ((pattern & 8U) != 0) {
      pattern = pattern & 0xffe7U | 0x10;
    }
    return pattern;
  }
  return pattern & 0xffe7U | 8;
}

Assistant:

short DOMNodeImpl::reverseTreeOrderBitPattern(short pattern) const {

    if(pattern & DOMNode::DOCUMENT_POSITION_PRECEDING) {
        pattern &= ~DOMNode::DOCUMENT_POSITION_PRECEDING;
        pattern |= DOMNode::DOCUMENT_POSITION_FOLLOWING;
    }
    else if(pattern & DOMNode::DOCUMENT_POSITION_FOLLOWING) {
        pattern &= ~DOMNode::DOCUMENT_POSITION_FOLLOWING;
        pattern |= DOMNode::DOCUMENT_POSITION_PRECEDING;
    }

    if(pattern & DOMNode::DOCUMENT_POSITION_CONTAINED_BY) {
        pattern &= ~DOMNode::DOCUMENT_POSITION_CONTAINED_BY;
        pattern |= DOMNode::DOCUMENT_POSITION_CONTAINS;
    }
    else if(pattern & DOMNode::DOCUMENT_POSITION_CONTAINS) {
        pattern &= ~DOMNode::DOCUMENT_POSITION_CONTAINS;
        pattern |= DOMNode::DOCUMENT_POSITION_CONTAINED_BY;
    }

    return pattern;
}